

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void kratos::VerifyAssignmentVisitor::check_expr(Var *var,Stmt *stmt)

{
  Var *pVVar1;
  Var *var_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  VarException *pVVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar6;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  Var *local_d8;
  Var *pVStack_d0;
  Stmt *local_c8;
  Var *local_c0;
  ulong local_b8;
  string local_a0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_80;
  Var *local_68;
  undefined8 uStack_60;
  Stmt *local_48;
  Var *local_40;
  uint local_38;
  allocator_type local_31;
  
  bVar6 = var->type_ == Expression;
  local_48 = stmt;
  do {
    if (!bVar6) {
      return;
    }
    local_40 = (Var *)var[1].super_IRNode.fn_name_ln.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pVVar1 = (Var *)var[1].super_IRNode.fn_name_ln.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
    bVar6 = is_relational_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
    bVar2 = is_reduction_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
    bVar3 = is_expand_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
    var_00 = local_40;
    if ((!bVar6) && (!bVar2)) {
      uVar4 = (*(local_40->super_IRNode)._vptr_IRNode[7])(local_40);
      if (uVar4 != local_38 && !bVar3) {
        pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
        (*(var_00->super_IRNode)._vptr_IRNode[0x1f])(&local_68);
        uVar4 = (*(local_40->super_IRNode)._vptr_IRNode[7])();
        local_c8 = (Stmt *)(ulong)uVar4;
        local_b8 = (ulong)local_38;
        local_d8 = local_68;
        pVStack_d0 = (Var *)uStack_60;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_d8;
        format_str.size_ = 0x22d;
        format_str.data_ = (char *)0x29;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_a0,(detail *)"{0}\'s width should be {1} but used as {2}",format_str,args)
        ;
        pVStack_d0 = local_40;
        local_c8 = local_48;
        local_c0 = local_40->width_param_;
        __l._M_len = 4;
        __l._M_array = (iterator)&local_d8;
        local_d8 = var;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_80,__l,&local_31);
        VarException::VarException(pVVar5,&local_a0,&local_80);
        __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((pVVar1 != (Var *)0x0) &&
         (uVar4 = (**(code **)(((_Alloc_hider *)&(pVVar1->super_IRNode)._vptr_IRNode)->_M_p + 0x38))
                            (pVVar1), !bVar3 && uVar4 != local_38)) {
        pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
        (**(code **)(((_Alloc_hider *)&(pVVar1->super_IRNode)._vptr_IRNode)->_M_p + 0xf8))
                  (&local_68,pVVar1);
        uVar4 = (**(code **)(((_Alloc_hider *)&(pVVar1->super_IRNode)._vptr_IRNode)->_M_p + 0x38))
                          (pVVar1);
        local_c8 = (Stmt *)(ulong)uVar4;
        local_b8 = (ulong)local_38;
        local_d8 = local_68;
        pVStack_d0 = (Var *)uStack_60;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_d8;
        format_str_00.size_ = 0x22d;
        format_str_00.data_ = (char *)0x29;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_a0,(detail *)"{0}\'s width should be {1} but used as {2}",format_str_00,
                   args_00);
        local_c8 = local_48;
        local_c0 = pVVar1->width_param_;
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)&local_d8;
        local_d8 = var;
        pVStack_d0 = pVVar1;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_80,__l_00,&local_31);
        VarException::VarException(pVVar5,&local_a0,&local_80);
        __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (var_00->type_ == Expression) {
      check_expr(var_00,local_48);
    }
    if (pVVar1 == (Var *)0x0) {
      return;
    }
    bVar6 = true;
    var = pVVar1;
    if (pVVar1->type_ != Expression) {
      return;
    }
  } while( true );
}

Assistant:

void static inline check_expr(Var* var, Stmt* stmt) {
        if (var->type() == VarType::Expression) {
            auto* expr = reinterpret_cast<Expr*>(var);
            auto* left = expr->left;
            auto* right = expr->right;
            auto width = var->width();
            bool is_relational = is_relational_op(expr->op);
            bool is_reduction = is_reduction_op(expr->op);
            bool is_expand = is_expand_op(expr->op);
            if (!is_relational && !is_reduction && left->width() != width && !is_expand) {
                throw VarException(::format("{0}'s width should be {1} but used as {2}",
                                            left->to_string(), left->width(), width),
                                   {var, left, stmt, left->width_param()});
            }
            if (!is_relational && !is_reduction && right && right->width() != width && !is_expand) {
                throw VarException(::format("{0}'s width should be {1} but used as {2}",
                                            right->to_string(), right->width(), width),
                                   {var, right, stmt, right->width_param()});
            }
            if (left->type() == VarType::Expression) {
                check_expr(left, stmt);
            }
            if (right && right->type() == VarType::Expression) {
                check_expr(right, stmt);
            }
        }
    }